

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

void __thiscall
compiler::CompilerAstWalker::onExitDeclareStatementAstNode
          (CompilerAstWalker *this,DeclareStatementAstNode *node)

{
  EmissionContext *this_00;
  pointer pVVar1;
  bool mustBeTrue;
  ulong uVar2;
  undefined8 uVar3;
  ByteCode bc;
  string local_48;
  size_t local_28;
  size_t index;
  
  local_28 = 0;
  mustBeTrue = EmissionContext::GetDeclarationIndex
                         ((this->ec).
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&((node->identifier).
                                   super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                                  value,&local_28,true);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not find local declaration for declare statement","");
  Error::assertWithPanic(mustBeTrue,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_00 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  pVVar1 = (this_00->variables).
           super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this_00->variables).
                 super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) *
          -0x3333333333333333;
  if (local_28 <= uVar2 && uVar2 - local_28 != 0) {
    pVVar1[local_28].isFullyBound = true;
    bc.parameter = local_28;
    bc._0_8_ = 0x10;
    EmissionContext::EmitByteCode(this_00,bc);
    return;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     local_28,uVar2);
  __clang_call_terminate(uVar3);
}

Assistant:

void onExitDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    std::size_t index = 0;
    bool find = this->ec->GetDeclarationIndex(node->identifier->value, index, true);
    Error::assertWithPanic(find, "Could not find local declaration for declare statement");
    this->ec->FullyBind(index);
    this->emit(bytecode::ByteCodeInstruction::SetLocal, index);
  }